

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O0

InsertResult __thiscall
wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (OrderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  value_type pLVar1;
  reference ppLVar2;
  bool bVar3;
  ulong local_30;
  size_t j;
  size_t i;
  LocalSet **x_local;
  OrderedFixedStorage<wasm::LocalSet_*,_2UL> *this_local;
  
  j = 0;
  while( true ) {
    bVar3 = false;
    if (j < (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used) {
      ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                          (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,j);
      bVar3 = *ppLVar2 < *x;
    }
    if (!bVar3) break;
    j = j + 1;
  }
  if ((j < (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used) &&
     (ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                          (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,j),
     *ppLVar2 == *x)) {
    this_local._4_4_ = NoError;
  }
  else {
    if (2 < (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used) {
      __assert_fail("this->used <= N",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                    ,99,
                    "InsertResult wasm::OrderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
                   );
    }
    if ((this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used == 2) {
      this_local._4_4_ = CouldNotInsert;
    }
    else {
      if (j != (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used) {
        for (local_30 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
            j + 1 <= local_30; local_30 = local_30 - 1) {
          ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                              (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,
                               local_30 - 1);
          pLVar1 = *ppLVar2;
          ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                              (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,
                               local_30);
          *ppLVar2 = pLVar1;
        }
      }
      pLVar1 = *x;
      ppLVar2 = std::array<wasm::LocalSet_*,_2UL>::operator[]
                          (&(this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage,j);
      *ppLVar2 = pLVar1;
      (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used =
           (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used + 1;
      this_local._4_4_ = NoError;
    }
  }
  return this_local._4_4_;
}

Assistant:

InsertResult insert(const T& x) {
    // Find the insertion point |i| where x should be placed.
    size_t i = 0;
    while (i < this->used && this->storage[i] < x) {
      i++;
    }
    if (i < this->used && this->storage[i] == x) {
      // The item already exists.
      return InsertResult::NoError;
    }
    // |i| is now the location where x should be placed.

    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }

    if (i != this->used) {
      // Push things forward to make room for x.
      for (size_t j = this->used; j >= i + 1; j--) {
        this->storage[j] = this->storage[j - 1];
      }
    }

    this->storage[i] = x;
    this->used++;
    return InsertResult::NoError;
  }